

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

ADAPTER_VENDOR Diligent::VendorIdToAdapterVendor(Uint32 VendorId)

{
  undefined1 local_9;
  Uint32 VendorId_local;
  
  if (VendorId == 0x1002) {
    local_9 = ADAPTER_VENDOR_AMD;
  }
  else if (VendorId == 0x1010) {
    local_9 = ADAPTER_VENDOR_IMGTECH;
  }
  else if (VendorId == 0x106b) {
    local_9 = ADAPTER_VENDOR_APPLE;
  }
  else if (VendorId == 0x10de) {
    local_9 = ADAPTER_VENDOR_NVIDIA;
  }
  else if (VendorId == 0x13b5) {
    local_9 = ADAPTER_VENDOR_ARM;
  }
  else if (VendorId == 0x1414) {
    local_9 = ADAPTER_VENDOR_MSFT;
  }
  else if (VendorId == 0x14e4) {
    local_9 = ADAPTER_VENDOR_BROADCOM;
  }
  else if (VendorId == 0x5143) {
    local_9 = ADAPTER_VENDOR_QUALCOMM;
  }
  else if (VendorId == 0x8086) {
    local_9 = ADAPTER_VENDOR_INTEL;
  }
  else if (VendorId == 0x10005) {
    local_9 = ADAPTER_VENDOR_MESA;
  }
  else {
    local_9 = ADAPTER_VENDOR_UNKNOWN;
  }
  return local_9;
}

Assistant:

ADAPTER_VENDOR VendorIdToAdapterVendor(Uint32 VendorId)
{
    static_assert(ADAPTER_VENDOR_LAST == 10, "Please update the switch below to handle the new adapter type");
    switch (VendorId)
    {
#define VENDOR_ID_TO_VENDOR(Name) \
    case ADAPTER_VENDOR_ID_##Name: return ADAPTER_VENDOR_##Name

        VENDOR_ID_TO_VENDOR(AMD);
        VENDOR_ID_TO_VENDOR(NVIDIA);
        VENDOR_ID_TO_VENDOR(INTEL);
        VENDOR_ID_TO_VENDOR(ARM);
        VENDOR_ID_TO_VENDOR(QUALCOMM);
        VENDOR_ID_TO_VENDOR(IMGTECH);
        VENDOR_ID_TO_VENDOR(MSFT);
        VENDOR_ID_TO_VENDOR(APPLE);
        VENDOR_ID_TO_VENDOR(MESA);
        VENDOR_ID_TO_VENDOR(BROADCOM);
#undef VENDOR_ID_TO_VENDOR

        default:
            return ADAPTER_VENDOR_UNKNOWN;
    }
}